

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

resource loader::anon_unknown_0::pe_reader::find_resource
                   (istream *is,uint32_t name,uint32_t type,uint32_t language)

{
  resource rVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  uint32_t address;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  istream *in_RDI;
  uint32_t data_offset;
  uint32_t data_size;
  uint32_t data_address;
  uint32_t leaf_offset;
  uint32_t name_offset;
  uint32_t type_offset;
  uint32_t resource_offset;
  section_table sections;
  header coff;
  resource result;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint32_t in_stack_ffffffffffffff04;
  istream *in_stack_ffffffffffffff08;
  istream *piVar8;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  header *in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff34;
  section_table *this;
  header *in_stack_ffffffffffffff50;
  istream *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  undefined8 local_98;
  undefined8 local_90;
  uint32_t local_84;
  undefined8 local_80;
  undefined8 local_78;
  uint32_t local_6c;
  undefined8 local_68;
  undefined8 local_60;
  uint32_t local_54;
  undefined4 local_50;
  section_table local_40 [2];
  istream *local_10;
  uint32_t local_8;
  uint uStack_4;
  
  uStack_4 = 0;
  local_8 = 0;
  local_10 = in_RDI;
  bVar3 = header::load(in_stack_ffffffffffffff18,
                       (istream *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  if (bVar3) {
    this = local_40;
    section_table::section_table((section_table *)0x168a7a);
    bVar3 = section_table::load((section_table *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    uVar7 = local_8;
    uVar2 = uStack_4;
    if ((bVar3) &&
       (address = section_table::to_file_offset(this,in_stack_ffffffffffffff34), piVar8 = local_10,
       local_54 = address, uVar7 = local_8, uVar2 = uStack_4, address != 0)) {
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      std::istream::seekg(piVar8,local_68,local_60);
      local_6c = find_resource_entry(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
      bVar3 = get_resource_table(&local_6c,local_54);
      uVar7 = local_8;
      uVar2 = uStack_4;
      if (bVar3) {
        piVar8 = local_10;
        std::fpos<__mbstate_t>::fpos
                  ((fpos<__mbstate_t> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        std::istream::seekg(piVar8,local_80,local_78);
        local_84 = find_resource_entry(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
        bVar3 = get_resource_table(&local_84,local_54);
        uVar7 = local_8;
        uVar2 = uStack_4;
        if (bVar3) {
          piVar8 = local_10;
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)
                     CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          std::istream::seekg(piVar8,local_98,local_90);
          uVar5 = find_resource_entry(piVar8,in_stack_ffffffffffffff04);
          uVar7 = local_8;
          uVar2 = uStack_4;
          if ((uVar5 != 0) &&
             (bVar3 = get_resource_table((uint32_t *)&stack0xffffffffffffff64,local_54),
             uVar7 = local_8, uVar2 = uStack_4, !bVar3)) {
            std::fpos<__mbstate_t>::fpos
                      ((fpos<__mbstate_t> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            std::istream::seekg(local_10,in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
            util::load<unsigned_int>((istream *)0x168d2a);
            uVar6 = util::load<unsigned_int>((istream *)0x168d45);
            bVar4 = std::ios::fail();
            uVar7 = local_8;
            uVar2 = uStack_4;
            if (((bVar4 & 1) == 0) &&
               (uVar7 = section_table::to_file_offset(this,address), uVar2 = uVar6, uVar7 == 0)) {
              uVar7 = local_8;
              uVar2 = uStack_4;
            }
          }
        }
      }
    }
    uStack_4 = uVar2;
    local_8 = uVar7;
    local_50 = 1;
    section_table::~section_table((section_table *)0x168de6);
  }
  rVar1.size = uStack_4;
  rVar1.offset = local_8;
  return rVar1;
}

Assistant:

pe_reader::resource pe_reader::find_resource(std::istream & is, boost::uint32_t name,
                                             boost::uint32_t type,
                                             boost::uint32_t language) {
	
	resource result;
	result.offset = result.size = 0;
	
	header coff;
	if(!coff.load(is)) {
		return result;
	}
	
	section_table sections;
	if(!sections.load(is, coff)) {
		return result;
	}
	
	boost::uint32_t resource_offset = sections.to_file_offset(coff.resource_table_address);
	if(!resource_offset) {
		return result;
	}
	
	is.seekg(resource_offset);
	boost::uint32_t type_offset = find_resource_entry(is, type);
	if(!get_resource_table(type_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(type_offset);
	boost::uint32_t name_offset = find_resource_entry(is, name);
	if(!get_resource_table(name_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(name_offset);
	boost::uint32_t leaf_offset = find_resource_entry(is, language);
	if(!leaf_offset || get_resource_table(leaf_offset, resource_offset)) {
		return result;
	}
	
	// Virtual memory address and size of the resource data.
	is.seekg(leaf_offset);
	boost::uint32_t data_address = util::load<boost::uint32_t>(is);
	boost::uint32_t data_size = util::load<boost::uint32_t>(is);
	// ignore codepage and reserved word
	if(is.fail()) {
		return result;
	}
	
	boost::uint32_t data_offset = sections.to_file_offset(data_address);
	if(!data_offset) {
		return result;
	}
	
	result.offset = data_offset;
	result.size = data_size;
	
	return result;
}